

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa-gpio.c
# Opt level: O0

int list_platform_pins(uint8_t platform_offset)

{
  int iVar1;
  int iVar2;
  char *__s1;
  uint local_24;
  char *pin_name;
  int pin_id;
  int i;
  int pin_count;
  uint8_t platform_offset_local;
  
  iVar1 = mraa_get_platform_pin_count(platform_offset);
  for (pin_name._4_4_ = 0; (int)pin_name._4_4_ < iVar1; pin_name._4_4_ = pin_name._4_4_ + 1) {
    if (platform_offset == '\0') {
      local_24 = pin_name._4_4_;
    }
    else {
      local_24 = mraa_get_sub_platform_id(pin_name._4_4_);
    }
    __s1 = (char *)mraa_get_pin_name(local_24);
    iVar2 = strcmp(__s1,"INVALID");
    if (iVar2 != 0) {
      iVar2 = mraa_pin_mode_test(local_24,0);
      if (iVar2 != 0) {
        fprintf(_stdout,"%02d ",(ulong)local_24);
        fprintf(_stdout,"%*s: ",0xb,__s1);
        iVar2 = mraa_pin_mode_test(local_24,1);
        if (iVar2 != 0) {
          fprintf(_stdout,"GPIO ");
        }
        iVar2 = mraa_pin_mode_test(local_24,5);
        if (iVar2 != 0) {
          fprintf(_stdout,"I2C  ");
        }
        iVar2 = mraa_pin_mode_test(local_24,4);
        if (iVar2 != 0) {
          fprintf(_stdout,"SPI  ");
        }
        iVar2 = mraa_pin_mode_test(local_24,2);
        if (iVar2 != 0) {
          fprintf(_stdout,"PWM  ");
        }
        iVar2 = mraa_pin_mode_test(local_24,6);
        if (iVar2 != 0) {
          fprintf(_stdout,"AIO  ");
        }
        iVar2 = mraa_pin_mode_test(local_24,7);
        if (iVar2 != 0) {
          fprintf(_stdout,"UART ");
        }
        fprintf(_stdout,"\n");
      }
    }
  }
  return iVar1;
}

Assistant:

int
list_platform_pins(uint8_t platform_offset)
{
    int pin_count = mraa_get_platform_pin_count(platform_offset);
    int i;
    for (i = 0; i < pin_count; ++i) {
        int pin_id = platform_offset > 0 ? mraa_get_sub_platform_id(i) : i;
        char* pin_name = mraa_get_pin_name(pin_id);
        if (strcmp(pin_name, "INVALID")  != 0 && mraa_pin_mode_test(pin_id, MRAA_PIN_VALID)) {
            fprintf(stdout, "%02d ", pin_id);
            fprintf(stdout, "%*s: ", (MRAA_PIN_NAME_SIZE - 1), pin_name);
            if (mraa_pin_mode_test(pin_id, MRAA_PIN_GPIO))
                fprintf(stdout, "GPIO ");
            if (mraa_pin_mode_test(pin_id, MRAA_PIN_I2C))
                fprintf(stdout, "I2C  ");
            if (mraa_pin_mode_test(pin_id, MRAA_PIN_SPI))
                fprintf(stdout, "SPI  ");
            if (mraa_pin_mode_test(pin_id, MRAA_PIN_PWM))
                fprintf(stdout, "PWM  ");
            if (mraa_pin_mode_test(pin_id, MRAA_PIN_AIO))
                fprintf(stdout, "AIO  ");
            if (mraa_pin_mode_test(pin_id, MRAA_PIN_UART))
                fprintf(stdout, "UART ");
            fprintf(stdout, "\n");
        }
    }
    return pin_count;    
}